

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O0

bool __thiscall NaVector::operator==(NaVector *this,NaVector *rVect)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long *in_RSI;
  long *in_RDI;
  double dVar4;
  double dVar5;
  uint i;
  uint local_1c;
  bool local_1;
  
  iVar1 = (**(code **)(*in_RDI + 0x30))();
  iVar2 = (**(code **)(*in_RSI + 0x30))();
  if (iVar1 == iVar2) {
    for (local_1c = 0; uVar3 = (**(code **)(*in_RDI + 0x30))(), local_1c < uVar3;
        local_1c = local_1c + 1) {
      dVar4 = (double)(**(code **)(*in_RDI + 0x48))(in_RDI,local_1c);
      dVar5 = (double)(**(code **)(*in_RSI + 0x48))(in_RSI,local_1c);
      if ((dVar4 != dVar5) || (NAN(dVar4) || NAN(dVar5))) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
NaVector::operator== (const NaVector& rVect) const
{
  unsigned	i;
  if(dim() != rVect.dim())
    return false;
  for(i = 0; i < dim(); ++i)
    if(get(i) != rVect.get(i))
      return false;
  return true;
}